

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

String * __thiscall
doctest::String::operator+(String *__return_storage_ptr__,String *this,String *other)

{
  EVP_PKEY_CTX *src;
  String local_30;
  
  copy(&local_30,(EVP_PKEY_CTX *)this,(EVP_PKEY_CTX *)other);
  operator+=(&local_30,other);
  copy(__return_storage_ptr__,(EVP_PKEY_CTX *)&local_30,src);
  ~String(&local_30);
  return __return_storage_ptr__;
}

Assistant:

String String::operator+(const String& other) const { return String(*this) += other; }